

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_mask_payload(uint8_t *payload,size_t payload_len,uint8_t *mask,size_t mask_len,
                        int *mask_start_pos)

{
  uint i;
  int *mask_start_pos_local;
  size_t mask_len_local;
  uint8_t *mask_local;
  size_t payload_len_local;
  uint8_t *payload_local;
  
  if (mask_start_pos == (int *)0x0) {
    for (i = 0; i < payload_len; i = i + 1) {
      payload[i] = payload[i] ^ mask[(ulong)i % mask_len];
    }
  }
  else {
    for (i = 0; i < payload_len; i = i + 1) {
      payload[i] = payload[i] ^ mask[(ulong)(i + *mask_start_pos) % mask_len];
    }
    *mask_start_pos = (int)((ulong)(i + *mask_start_pos) % mask_len);
  }
  return;
}

Assistant:

static void nn_sws_mask_payload (uint8_t *payload, size_t payload_len,
    const uint8_t *mask, size_t mask_len, int *mask_start_pos)
{
    unsigned i;

    if (mask_start_pos) {
        for (i = 0; i < payload_len; i++) {
            payload [i] ^= mask [(i + *mask_start_pos) % mask_len];
        }

        *mask_start_pos = (i + *mask_start_pos) % mask_len;

        return;
    }
    else {
        for (i = 0; i < payload_len; i++) {
            payload [i] ^= mask [i % mask_len];
        }
        return;
    }
}